

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_highbd_filter_intra_edge_c(uint16_t *p,int sz,int strength)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int j;
  long lVar4;
  int iVar5;
  uint16_t edge [129];
  ushort auStack_128 [132];
  
  if (strength != 0) {
    memcpy(auStack_128,p,(long)sz * 2);
    if (1 < sz) {
      uVar1 = 1;
      iVar2 = -1;
      do {
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar5 = iVar2 + (int)lVar4;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (sz + -1 <= iVar5) {
            iVar5 = sz + -1;
          }
          iVar3 = iVar3 + (uint)auStack_128[iVar5] * tx_size_high[lVar4 + (long)strength * 5 + 0xf];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 5);
        p[uVar1] = (uint16_t)(iVar3 + 8U >> 4);
        uVar1 = uVar1 + 1;
        iVar2 = iVar2 + 1;
      } while (uVar1 != (uint)sz);
    }
  }
  return;
}

Assistant:

void av1_highbd_filter_intra_edge_c(uint16_t *p, int sz, int strength) {
  if (!strength) return;

  const int kernel[INTRA_EDGE_FILT][INTRA_EDGE_TAPS] = { { 0, 4, 8, 4, 0 },
                                                         { 0, 5, 6, 5, 0 },
                                                         { 2, 4, 4, 4, 2 } };
  const int filt = strength - 1;
  uint16_t edge[129];

  memcpy(edge, p, sz * sizeof(*p));
  for (int i = 1; i < sz; i++) {
    int s = 0;
    for (int j = 0; j < INTRA_EDGE_TAPS; j++) {
      int k = i - 2 + j;
      k = (k < 0) ? 0 : k;
      k = (k > sz - 1) ? sz - 1 : k;
      s += edge[k] * kernel[filt][j];
    }
    s = (s + 8) >> 4;
    p[i] = s;
  }
}